

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_sqrt_sort_sort_ins(int64_t *arr,int len)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  bool bVar2;
  int j;
  int i;
  undefined4 local_14;
  undefined4 local_10;
  
  for (local_10 = 1; iVar1 = local_10, local_10 < in_ESI; local_10 = local_10 + 1) {
    while( true ) {
      local_14 = iVar1 + -1;
      bVar2 = false;
      if (-1 < local_14) {
        bVar2 = *(long *)(in_RDI + (long)iVar1 * 8) - *(long *)(in_RDI + (long)local_14 * 8) < 0;
      }
      if (!bVar2) break;
      sorter_sqrt_sort_swap_1
                ((int64_t *)(in_RDI + (long)local_14 * 8),(int64_t *)(in_RDI + (long)iVar1 * 8));
      iVar1 = local_14;
    }
  }
  return;
}

Assistant:

static void SQRT_SORT_SORT_INS(SORT_TYPE *arr, int len) {
  int i, j;

  for (i = 1; i < len; i++) {
    for (j = i - 1; j >= 0 && SORT_CMP_A(arr + (j + 1), arr + j) < 0; j--) {
      SQRT_SORT_SWAP_1(arr + j, arr + (j + 1));
    }
  }
}